

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_info.cc
# Opt level: O0

void X509_INFO_free(X509_INFO *a)

{
  X509_INFO *x_local;
  
  if (a != (X509_INFO *)0x0) {
    X509_free(a->x509);
    X509_CRL_free(a->crl);
    X509_PKEY_free(a->x_pkey);
    OPENSSL_free(a->enc_data);
    OPENSSL_free(a);
  }
  return;
}

Assistant:

void X509_INFO_free(X509_INFO *x) {
  if (x == NULL) {
    return;
  }

  X509_free(x->x509);
  X509_CRL_free(x->crl);
  X509_PKEY_free(x->x_pkey);
  OPENSSL_free(x->enc_data);
  OPENSSL_free(x);
}